

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_math.c
# Opt level: O2

float swap_median(float *arr,int n)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  float t_2;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float t;
  float fVar22;
  float fVar23;
  float t_7;
  float fVar24;
  float fVar25;
  float t_4;
  float fVar26;
  float t_6;
  float t_39;
  float t_62;
  float t_15;
  float t_59;
  float t_42;
  float t_14;
  float t_51;
  float t_47;
  float t_66;
  float t_40;
  float t_48;
  float local_40;
  float local_3c;
  float t_41;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  
  switch(n - 3U >> 1 | (uint)((n - 3U & 1) != 0) << 0x1f) {
  case 0:
    fVar19 = *arr;
    fVar21 = arr[1];
    fVar10 = fVar19;
    if (fVar21 < fVar19) {
      *arr = fVar21;
      arr[1] = fVar19;
      fVar10 = fVar21;
      fVar21 = fVar19;
    }
    fVar19 = arr[2];
    if (fVar19 < fVar21) {
      arr[1] = fVar19;
      arr[2] = fVar21;
      fVar21 = fVar19;
    }
    if (fVar21 < fVar10) {
      *arr = fVar21;
      arr[1] = fVar10;
      fVar21 = fVar10;
    }
    break;
  case 1:
    fVar19 = *arr;
    fVar10 = arr[1];
    fVar11 = fVar10;
    if (fVar10 < fVar19) {
      *arr = fVar10;
      arr[1] = fVar19;
      fVar11 = fVar19;
      fVar19 = fVar10;
    }
    fVar10 = arr[3];
    fVar21 = arr[4];
    fVar20 = fVar21;
    if (fVar21 < fVar10) {
      arr[3] = fVar21;
      arr[4] = fVar10;
      fVar20 = fVar10;
      fVar10 = fVar21;
    }
    if (fVar10 < fVar19) {
      *arr = fVar10;
      arr[3] = fVar19;
      fVar10 = fVar19;
    }
    if (fVar20 < fVar11) {
      arr[1] = fVar20;
      arr[4] = fVar11;
      fVar11 = fVar20;
    }
    fVar21 = arr[2];
    fVar19 = fVar11;
    if (fVar21 < fVar11) {
      arr[1] = fVar21;
      arr[2] = fVar11;
      fVar19 = fVar21;
      fVar21 = fVar11;
    }
    if (fVar10 < fVar21) {
      arr[2] = fVar10;
      arr[3] = fVar21;
      fVar21 = fVar10;
    }
    if (fVar21 < fVar19) {
      arr[1] = fVar21;
      arr[2] = fVar19;
      fVar21 = fVar19;
    }
    break;
  case 2:
    fVar19 = *arr;
    fVar10 = arr[5];
    fVar11 = fVar10;
    if (fVar10 < fVar19) {
      *arr = fVar10;
      arr[5] = fVar19;
      fVar11 = fVar19;
      fVar19 = fVar10;
    }
    fVar10 = arr[3];
    fVar21 = fVar19;
    if (fVar10 < fVar19) {
      *arr = fVar10;
      arr[3] = fVar19;
      fVar21 = fVar10;
      fVar10 = fVar19;
    }
    fVar19 = arr[1];
    fVar20 = arr[6];
    fVar22 = fVar19;
    if (fVar20 < fVar19) {
      arr[1] = fVar20;
      arr[6] = fVar19;
      fVar22 = fVar20;
      fVar20 = fVar19;
    }
    fVar19 = arr[2];
    fVar24 = arr[4];
    fVar12 = fVar24;
    if (fVar24 < fVar19) {
      arr[2] = fVar24;
      arr[4] = fVar19;
      fVar12 = fVar19;
      fVar19 = fVar24;
    }
    if (fVar22 < fVar21) {
      *arr = fVar22;
      arr[1] = fVar21;
      fVar22 = fVar21;
    }
    fVar21 = fVar10;
    if (fVar11 < fVar10) {
      arr[3] = fVar11;
      arr[5] = fVar10;
      fVar21 = fVar11;
      fVar11 = fVar10;
    }
    fVar10 = fVar19;
    if (fVar20 < fVar19) {
      arr[2] = fVar20;
      arr[6] = fVar19;
      fVar10 = fVar20;
      fVar20 = fVar19;
    }
    if (fVar21 < fVar10) {
      arr[2] = fVar21;
      arr[3] = fVar10;
      fVar21 = fVar10;
    }
    if (fVar20 < fVar21) {
      arr[3] = fVar20;
      arr[6] = fVar21;
      fVar21 = fVar20;
    }
    if (fVar11 < fVar12) {
      arr[4] = fVar11;
      arr[5] = fVar12;
      fVar12 = fVar11;
    }
    fVar19 = fVar12;
    if (fVar12 < fVar22) {
      arr[1] = fVar12;
      arr[4] = fVar22;
      fVar19 = fVar22;
      fVar22 = fVar12;
    }
    if (fVar21 < fVar22) {
      arr[1] = fVar21;
      arr[3] = fVar22;
      fVar21 = fVar22;
    }
    if (fVar19 < fVar21) {
      arr[3] = fVar19;
      arr[4] = fVar21;
      fVar21 = fVar19;
    }
    break;
  case 3:
    fVar19 = arr[1];
    fVar10 = arr[2];
    fVar11 = fVar10;
    if (fVar10 < fVar19) {
      arr[1] = fVar10;
      arr[2] = fVar19;
      fVar11 = fVar19;
      fVar19 = fVar10;
    }
    fVar10 = arr[4];
    fVar21 = arr[5];
    fVar20 = fVar10;
    if (fVar21 < fVar10) {
      arr[4] = fVar21;
      arr[5] = fVar10;
      fVar20 = fVar21;
      fVar21 = fVar10;
    }
    fVar10 = arr[7];
    fVar22 = arr[8];
    fVar24 = fVar22;
    if (fVar22 < fVar10) {
      arr[7] = fVar22;
      arr[8] = fVar10;
      fVar24 = fVar10;
      fVar10 = fVar22;
    }
    fVar22 = *arr;
    fVar12 = fVar22;
    if (fVar19 < fVar22) {
      *arr = fVar19;
      arr[1] = fVar22;
      fVar12 = fVar19;
      fVar19 = fVar22;
    }
    fVar22 = arr[3];
    fVar18 = fVar20;
    if (fVar20 < fVar22) {
      arr[3] = fVar20;
      arr[4] = fVar22;
      fVar18 = fVar22;
      fVar22 = fVar20;
    }
    fVar20 = arr[6];
    fVar13 = fVar10;
    if (fVar10 < fVar20) {
      arr[6] = fVar10;
      arr[7] = fVar20;
      fVar13 = fVar20;
      fVar20 = fVar10;
    }
    fVar10 = fVar19;
    if (fVar11 < fVar19) {
      arr[1] = fVar11;
      arr[2] = fVar19;
      fVar10 = fVar11;
      fVar11 = fVar19;
    }
    fVar19 = fVar21;
    if (fVar21 < fVar18) {
      arr[4] = fVar21;
      arr[5] = fVar18;
      fVar19 = fVar18;
      fVar18 = fVar21;
    }
    fVar21 = fVar24;
    if (fVar24 < fVar13) {
      arr[7] = fVar24;
      arr[8] = fVar13;
      fVar21 = fVar13;
      fVar13 = fVar24;
    }
    if (fVar22 < fVar12) {
      *arr = fVar22;
      arr[3] = fVar12;
      fVar22 = fVar12;
    }
    if (fVar21 < fVar19) {
      arr[5] = fVar21;
      arr[8] = fVar19;
      fVar19 = fVar21;
    }
    fVar21 = fVar18;
    if (fVar13 < fVar18) {
      arr[4] = fVar13;
      arr[7] = fVar18;
      fVar21 = fVar13;
      fVar13 = fVar18;
    }
    if (fVar20 < fVar22) {
      arr[3] = fVar20;
      arr[6] = fVar22;
      fVar20 = fVar22;
    }
    if (fVar21 < fVar10) {
      arr[1] = fVar21;
      arr[4] = fVar10;
      fVar21 = fVar10;
    }
    if (fVar19 < fVar11) {
      arr[2] = fVar19;
      arr[5] = fVar11;
      fVar11 = fVar19;
    }
    if (fVar13 < fVar21) {
      arr[4] = fVar13;
      arr[7] = fVar21;
      fVar21 = fVar13;
    }
    fVar19 = fVar11;
    if (fVar11 < fVar21) {
      arr[4] = fVar11;
      arr[2] = fVar21;
      fVar19 = fVar21;
      fVar21 = fVar11;
    }
    if (fVar21 < fVar20) {
      arr[6] = fVar21;
      arr[4] = fVar20;
      fVar21 = fVar20;
    }
    if (fVar19 < fVar21) {
      arr[4] = fVar19;
      arr[2] = fVar21;
      fVar21 = fVar19;
    }
    break;
  default:
    iVar5 = (int)(n - 1U) / 2;
    iVar8 = 0;
    uVar7 = n - 1U;
    while (iVar8 < (int)uVar7) {
      uVar4 = iVar8 + 1;
      uVar9 = (ulong)uVar4;
      if (uVar7 == uVar4) {
        fVar19 = arr[iVar8];
        if (arr[(int)uVar7] < fVar19) {
          arr[iVar8] = arr[(int)uVar7];
          arr[(int)uVar7] = fVar19;
        }
        break;
      }
      iVar2 = (int)(iVar8 + uVar7) / 2;
      fVar19 = arr[iVar2];
      fVar10 = arr[(int)uVar7];
      if (fVar10 < fVar19) {
        arr[iVar2] = fVar10;
        arr[(int)uVar7] = fVar19;
        fVar10 = fVar19;
      }
      fVar19 = arr[iVar8];
      if (fVar10 < fVar19) {
        arr[iVar8] = fVar10;
        arr[(int)uVar7] = fVar19;
        fVar19 = arr[iVar8];
      }
      fVar10 = arr[iVar2];
      if (fVar19 < fVar10) {
        arr[iVar2] = fVar19;
        arr[iVar8] = fVar10;
        fVar10 = arr[iVar2];
      }
      arr[iVar2] = arr[(int)uVar4];
      arr[(int)uVar4] = fVar10;
      uVar4 = uVar7;
      while( true ) {
        fVar19 = arr[iVar8];
        uVar9 = (ulong)(int)uVar9;
        do {
          fVar10 = arr[uVar9 + 1];
          uVar9 = uVar9 + 1;
        } while (fVar10 < fVar19);
        lVar1 = (long)(int)uVar4 + 1;
        do {
          uVar3 = uVar4;
          lVar6 = lVar1;
          fVar21 = arr[lVar6 + -2];
          uVar4 = uVar3 - 1;
          lVar1 = lVar6 + -1;
        } while (fVar19 < fVar21);
        if (lVar6 + -1 <= (long)uVar9) break;
        arr[uVar9] = fVar21;
        arr[lVar6 + -2] = fVar10;
      }
      arr[iVar8] = fVar21;
      arr[lVar6 + -2] = fVar19;
      if ((int)uVar4 <= iVar5) {
        iVar8 = (int)uVar9;
      }
      if (iVar5 < (int)uVar3) {
        uVar7 = uVar3 - 2;
      }
    }
    fVar21 = arr[iVar5];
    break;
  case 0xb:
    fVar19 = *arr;
    fVar10 = arr[1];
    fVar21 = fVar19;
    if (fVar10 < fVar19) {
      *arr = fVar10;
      arr[1] = fVar19;
      fVar21 = fVar10;
      fVar10 = fVar19;
    }
    fVar19 = arr[3];
    fVar11 = arr[4];
    local_18 = fVar11;
    if (fVar11 < fVar19) {
      arr[3] = fVar11;
      arr[4] = fVar19;
      local_18 = fVar19;
      fVar19 = fVar11;
    }
    fVar11 = arr[2];
    fVar20 = fVar11;
    if (local_18 < fVar11) {
      arr[2] = local_18;
      arr[4] = fVar11;
      fVar20 = local_18;
      local_18 = fVar11;
    }
    local_14 = fVar19;
    if (fVar19 < fVar20) {
      arr[2] = fVar19;
      arr[3] = fVar20;
      local_14 = fVar20;
      fVar20 = fVar19;
    }
    local_2c = arr[6];
    fVar19 = arr[7];
    local_20 = fVar19;
    if (fVar19 < local_2c) {
      arr[6] = fVar19;
      arr[7] = local_2c;
      local_20 = local_2c;
      local_2c = fVar19;
    }
    fVar19 = arr[5];
    fVar11 = fVar19;
    if (local_20 < fVar19) {
      arr[5] = local_20;
      arr[7] = fVar19;
      fVar11 = local_20;
      local_20 = fVar19;
    }
    local_10 = fVar11;
    if (local_2c < fVar11) {
      arr[5] = local_2c;
      arr[6] = fVar11;
      local_10 = local_2c;
      local_2c = fVar11;
    }
    local_40 = arr[9];
    fVar19 = arr[10];
    local_28 = fVar19;
    if (fVar19 < local_40) {
      arr[9] = fVar19;
      arr[10] = local_40;
      local_28 = local_40;
      local_40 = fVar19;
    }
    fVar19 = arr[8];
    fVar11 = fVar19;
    if (local_28 < fVar19) {
      arr[8] = local_28;
      arr[10] = fVar19;
      fVar11 = local_28;
      local_28 = fVar19;
    }
    fVar19 = fVar11;
    if (local_40 < fVar11) {
      arr[8] = local_40;
      arr[9] = fVar11;
      fVar19 = local_40;
      local_40 = fVar11;
    }
    fVar24 = local_40;
    fVar11 = arr[0xc];
    fVar22 = arr[0xd];
    fVar12 = fVar22;
    if (fVar22 < fVar11) {
      arr[0xc] = fVar22;
      arr[0xd] = fVar11;
      fVar12 = fVar11;
      fVar11 = fVar22;
    }
    fVar22 = arr[0xb];
    fVar18 = fVar22;
    if (fVar12 < fVar22) {
      arr[0xb] = fVar12;
      arr[0xd] = fVar22;
      fVar18 = fVar12;
      fVar12 = fVar22;
    }
    fVar22 = fVar18;
    if (fVar11 < fVar18) {
      arr[0xb] = fVar11;
      arr[0xc] = fVar18;
      fVar22 = fVar11;
      fVar11 = fVar18;
    }
    t_41 = arr[0xf];
    fVar18 = arr[0x10];
    local_30 = fVar18;
    if (fVar18 < t_41) {
      arr[0xf] = fVar18;
      arr[0x10] = t_41;
      local_30 = t_41;
      t_41 = fVar18;
    }
    fVar18 = arr[0xe];
    fVar13 = fVar18;
    if (local_30 < fVar18) {
      arr[0xe] = local_30;
      arr[0x10] = fVar18;
      fVar13 = local_30;
      local_30 = fVar18;
    }
    fVar18 = fVar13;
    if (t_41 < fVar13) {
      arr[0xe] = t_41;
      arr[0xf] = fVar13;
      fVar18 = t_41;
      t_41 = fVar13;
    }
    local_1c = arr[0x12];
    fVar13 = arr[0x13];
    fVar14 = fVar13;
    if (fVar13 < local_1c) {
      arr[0x12] = fVar13;
      arr[0x13] = local_1c;
      fVar14 = local_1c;
      local_1c = fVar13;
    }
    fVar13 = arr[0x11];
    fVar17 = fVar13;
    if (fVar14 < fVar13) {
      arr[0x11] = fVar14;
      arr[0x13] = fVar13;
      fVar17 = fVar14;
      fVar14 = fVar13;
    }
    fVar13 = fVar17;
    if (local_1c < fVar17) {
      arr[0x11] = local_1c;
      arr[0x12] = fVar17;
      fVar13 = local_1c;
      local_1c = fVar17;
    }
    fVar17 = arr[0x15];
    fVar25 = arr[0x16];
    local_3c = fVar25;
    if (fVar25 < fVar17) {
      arr[0x15] = fVar25;
      arr[0x16] = fVar17;
      local_3c = fVar17;
      fVar17 = fVar25;
    }
    fVar25 = arr[0x14];
    fVar15 = fVar25;
    if (local_3c < fVar25) {
      arr[0x14] = local_3c;
      arr[0x16] = fVar25;
      fVar15 = local_3c;
      local_3c = fVar25;
    }
    fVar25 = fVar15;
    if (fVar17 < fVar15) {
      arr[0x14] = fVar17;
      arr[0x15] = fVar15;
      fVar25 = fVar17;
      fVar17 = fVar15;
    }
    fVar15 = arr[0x17];
    local_34 = arr[0x18];
    fVar16 = fVar15;
    if (local_34 < fVar15) {
      arr[0x17] = local_34;
      arr[0x18] = fVar15;
      fVar16 = local_34;
      local_34 = fVar15;
    }
    fVar15 = fVar20;
    if (local_10 < fVar20) {
      arr[2] = local_10;
      arr[5] = fVar20;
      fVar15 = local_10;
      local_10 = fVar20;
    }
    fVar20 = local_2c;
    if (local_2c < local_14) {
      arr[3] = local_2c;
      arr[6] = local_14;
      fVar20 = local_14;
      local_14 = local_2c;
    }
    fVar23 = fVar21;
    local_2c = fVar20;
    if (fVar20 < fVar21) {
      *arr = fVar20;
      arr[6] = fVar21;
      fVar23 = fVar20;
      local_2c = fVar21;
    }
    fVar21 = fVar23;
    if (local_14 < fVar23) {
      *arr = local_14;
      arr[3] = fVar23;
      fVar21 = local_14;
      local_14 = fVar23;
    }
    fVar20 = local_20;
    if (local_20 < local_18) {
      arr[4] = local_20;
      arr[7] = local_18;
      fVar20 = local_18;
      local_18 = local_20;
    }
    fVar23 = fVar10;
    if (fVar20 < fVar10) {
      arr[1] = fVar20;
      arr[7] = fVar10;
      fVar23 = fVar20;
      fVar20 = fVar10;
    }
    fVar10 = fVar23;
    if (local_18 < fVar23) {
      arr[1] = local_18;
      arr[4] = fVar23;
      fVar10 = local_18;
      local_18 = fVar23;
    }
    fVar23 = fVar18;
    if (fVar18 < fVar22) {
      arr[0xb] = fVar18;
      arr[0xe] = fVar22;
      fVar23 = fVar22;
      fVar22 = fVar18;
    }
    local_40 = fVar19;
    if (fVar23 < fVar19) {
      arr[8] = fVar23;
      arr[0xe] = fVar19;
      local_40 = fVar23;
      fVar23 = fVar19;
    }
    fVar19 = fVar22;
    if (fVar22 < local_40) {
      arr[8] = fVar22;
      arr[0xb] = local_40;
      fVar19 = local_40;
      local_40 = fVar22;
    }
    fVar22 = t_41;
    if (t_41 < fVar11) {
      arr[0xc] = t_41;
      arr[0xf] = fVar11;
      fVar22 = fVar11;
      fVar11 = t_41;
    }
    fVar18 = fVar24;
    if (fVar22 < fVar24) {
      arr[9] = fVar22;
      arr[0xf] = fVar24;
      fVar18 = fVar22;
      fVar22 = fVar24;
    }
    fVar24 = fVar18;
    if (fVar11 < fVar18) {
      arr[9] = fVar11;
      arr[0xc] = fVar18;
      fVar24 = fVar11;
      fVar11 = fVar18;
    }
    fVar18 = fVar12;
    fVar26 = local_30;
    if (local_30 < fVar12) {
      arr[0xd] = local_30;
      arr[0x10] = fVar12;
      fVar18 = local_30;
      fVar26 = fVar12;
    }
    local_30 = fVar26;
    if (fVar26 < local_28) {
      arr[10] = fVar26;
      arr[0x10] = local_28;
      local_30 = local_28;
      local_28 = fVar26;
    }
    local_24 = local_28;
    if (fVar18 < local_28) {
      arr[10] = fVar18;
      arr[0xd] = local_28;
      local_24 = fVar18;
      fVar18 = local_28;
    }
    fVar12 = fVar25;
    if (fVar16 < fVar25) {
      arr[0x14] = fVar16;
      arr[0x17] = fVar25;
      fVar12 = fVar16;
      fVar16 = fVar25;
    }
    fVar25 = fVar13;
    t_41 = fVar16;
    if (fVar16 < fVar13) {
      arr[0x11] = fVar16;
      arr[0x17] = fVar13;
      fVar25 = fVar16;
      t_41 = fVar13;
    }
    fVar13 = fVar12;
    if (fVar12 < fVar25) {
      arr[0x11] = fVar12;
      arr[0x14] = fVar25;
      fVar13 = fVar25;
      fVar25 = fVar12;
    }
    fVar12 = fVar17;
    fVar16 = local_34;
    if (local_34 < fVar17) {
      arr[0x15] = local_34;
      arr[0x18] = fVar17;
      fVar12 = local_34;
      fVar16 = fVar17;
    }
    local_34 = fVar16;
    if (fVar16 < local_1c) {
      arr[0x12] = fVar16;
      arr[0x18] = local_1c;
      local_34 = local_1c;
      local_1c = fVar16;
    }
    fVar17 = fVar12;
    if (fVar12 < local_1c) {
      arr[0x12] = fVar12;
      arr[0x15] = local_1c;
      fVar17 = local_1c;
      local_1c = fVar12;
    }
    fVar12 = local_3c;
    if (local_3c < fVar14) {
      arr[0x13] = local_3c;
      arr[0x16] = fVar14;
      fVar12 = fVar14;
      fVar14 = local_3c;
    }
    local_3c = fVar14;
    if (fVar25 < local_40) {
      arr[8] = fVar25;
      arr[0x11] = local_40;
      fVar25 = local_40;
    }
    local_40 = fVar25;
    fVar14 = fVar24;
    if (local_1c < fVar24) {
      arr[9] = local_1c;
      arr[0x12] = fVar24;
      fVar14 = local_1c;
      local_1c = fVar24;
    }
    fVar24 = fVar21;
    local_28 = local_1c;
    if (local_1c < fVar21) {
      *arr = local_1c;
      arr[0x12] = fVar21;
      fVar24 = local_1c;
      local_28 = fVar21;
    }
    if (fVar14 < fVar24) {
      *arr = fVar14;
      arr[9] = fVar24;
      fVar14 = fVar24;
    }
    fVar21 = local_3c;
    if (local_3c < local_24) {
      arr[10] = local_3c;
      arr[0x13] = local_24;
      fVar21 = local_24;
      local_24 = local_3c;
    }
    fVar24 = fVar10;
    if (fVar21 < fVar10) {
      arr[1] = fVar21;
      arr[0x13] = fVar10;
      fVar24 = fVar21;
      fVar21 = fVar10;
    }
    fVar10 = fVar24;
    if (local_24 < fVar24) {
      arr[1] = local_24;
      arr[10] = fVar24;
      fVar10 = local_24;
      local_24 = fVar24;
    }
    fVar24 = fVar19;
    if (fVar13 < fVar19) {
      arr[0xb] = fVar13;
      arr[0x14] = fVar19;
      fVar24 = fVar13;
      fVar13 = fVar19;
    }
    fVar19 = fVar15;
    local_3c = fVar13;
    if (fVar13 < fVar15) {
      arr[2] = fVar13;
      arr[0x14] = fVar15;
      fVar19 = fVar13;
      local_3c = fVar15;
    }
    if (fVar24 < fVar19) {
      arr[2] = fVar24;
      arr[0xb] = fVar19;
      fVar24 = fVar19;
    }
    fVar19 = fVar11;
    if (fVar17 < fVar11) {
      arr[0xc] = fVar17;
      arr[0x15] = fVar11;
      fVar19 = fVar17;
      fVar17 = fVar11;
    }
    fVar11 = fVar17;
    if (fVar17 < local_14) {
      arr[3] = fVar17;
      arr[0x15] = local_14;
      fVar11 = local_14;
      local_14 = fVar17;
    }
    fVar13 = local_14;
    if (fVar19 < local_14) {
      arr[3] = fVar19;
      arr[0xc] = local_14;
      fVar13 = fVar19;
      fVar19 = local_14;
    }
    fVar17 = fVar18;
    if (fVar12 < fVar18) {
      arr[0xd] = fVar12;
      arr[0x16] = fVar18;
      fVar17 = fVar12;
      fVar12 = fVar18;
    }
    if (fVar12 < local_18) {
      arr[4] = fVar12;
      arr[0x16] = local_18;
      local_18 = fVar12;
    }
    fVar12 = local_18;
    if (fVar17 < local_18) {
      arr[4] = fVar17;
      arr[0xd] = local_18;
      fVar12 = fVar17;
      fVar17 = local_18;
    }
    fVar18 = t_41;
    if (t_41 < fVar23) {
      arr[0xe] = t_41;
      arr[0x17] = fVar23;
      fVar18 = fVar23;
      fVar23 = t_41;
    }
    fVar25 = fVar18;
    if (fVar18 < local_10) {
      arr[5] = fVar18;
      arr[0x17] = local_10;
      fVar25 = local_10;
      local_10 = fVar18;
    }
    fVar18 = fVar23;
    if (fVar23 < local_10) {
      arr[5] = fVar23;
      arr[0xe] = local_10;
      fVar18 = local_10;
      local_10 = fVar23;
    }
    fVar15 = local_34;
    if (local_34 < fVar22) {
      arr[0xf] = local_34;
      arr[0x18] = fVar22;
      fVar15 = fVar22;
      fVar22 = local_34;
    }
    if (fVar15 < local_2c) {
      arr[6] = fVar15;
      arr[0x18] = local_2c;
      local_2c = fVar15;
    }
    fVar15 = local_2c;
    if (fVar22 < local_2c) {
      arr[6] = fVar22;
      arr[0xf] = local_2c;
      fVar15 = fVar22;
      fVar22 = local_2c;
    }
    if (local_30 < fVar20) {
      arr[7] = local_30;
      arr[0x10] = fVar20;
      fVar20 = local_30;
    }
    if (fVar21 < fVar20) {
      arr[7] = fVar21;
      arr[0x13] = fVar20;
      fVar20 = fVar21;
    }
    if (fVar11 < fVar17) {
      arr[0xd] = fVar11;
      arr[0x15] = fVar17;
      fVar17 = fVar11;
    }
    if (fVar25 < fVar22) {
      arr[0xf] = fVar25;
      arr[0x17] = fVar22;
      fVar22 = fVar25;
    }
    if (fVar17 < fVar20) {
      arr[7] = fVar17;
      arr[0xd] = fVar20;
      fVar20 = fVar17;
    }
    if (fVar22 < fVar20) {
      arr[7] = fVar22;
      arr[0xf] = fVar20;
      fVar20 = fVar22;
    }
    if (fVar14 < fVar10) {
      arr[1] = fVar14;
      arr[9] = fVar10;
      fVar14 = fVar10;
    }
    if (fVar24 < fVar13) {
      arr[3] = fVar24;
      arr[0xb] = fVar13;
      fVar24 = fVar13;
    }
    if (local_40 < local_10) {
      arr[5] = local_40;
      arr[0x11] = local_10;
      local_40 = local_10;
    }
    if (local_40 < fVar24) {
      arr[0xb] = local_40;
      arr[0x11] = fVar24;
      local_40 = fVar24;
    }
    if (local_40 < fVar14) {
      arr[9] = local_40;
      arr[0x11] = fVar14;
      local_40 = fVar14;
    }
    fVar10 = fVar12;
    if (local_24 < fVar12) {
      arr[4] = local_24;
      arr[10] = fVar12;
      fVar10 = local_24;
      local_24 = fVar12;
    }
    fVar21 = fVar19;
    if (fVar19 < fVar15) {
      arr[6] = fVar19;
      arr[0xc] = fVar15;
      fVar21 = fVar15;
      fVar15 = fVar19;
    }
    fVar19 = fVar20;
    if (fVar18 < fVar20) {
      arr[7] = fVar18;
      arr[0xe] = fVar20;
      fVar19 = fVar18;
      fVar18 = fVar20;
    }
    fVar11 = fVar15;
    if (fVar15 < fVar10) {
      arr[4] = fVar15;
      arr[6] = fVar10;
      fVar11 = fVar10;
      fVar10 = fVar15;
    }
    if (fVar19 < fVar10) {
      arr[4] = fVar19;
      arr[7] = fVar10;
      fVar19 = fVar10;
    }
    fVar10 = fVar18;
    if (fVar18 < fVar21) {
      arr[0xc] = fVar18;
      arr[0xe] = fVar21;
      fVar10 = fVar21;
      fVar21 = fVar18;
    }
    if (fVar10 < local_24) {
      arr[10] = fVar10;
      arr[0xe] = local_24;
      local_24 = fVar10;
    }
    fVar10 = fVar19;
    if (fVar19 < fVar11) {
      arr[6] = fVar19;
      arr[7] = fVar11;
      fVar10 = fVar11;
      fVar11 = fVar19;
    }
    fVar19 = local_24;
    if (fVar21 < local_24) {
      arr[10] = fVar21;
      arr[0xc] = local_24;
      fVar19 = fVar21;
      fVar21 = local_24;
    }
    fVar20 = fVar19;
    if (fVar19 < fVar11) {
      arr[6] = fVar19;
      arr[10] = fVar11;
      fVar20 = fVar11;
      fVar11 = fVar19;
    }
    if (local_40 < fVar11) {
      arr[6] = local_40;
      arr[0x11] = fVar11;
      local_40 = fVar11;
    }
    fVar19 = local_40;
    if (local_40 < fVar21) {
      arr[0xc] = local_40;
      arr[0x11] = fVar21;
      fVar19 = fVar21;
      fVar21 = local_40;
    }
    if (fVar19 < fVar10) {
      arr[7] = fVar19;
      arr[0x11] = fVar10;
      fVar10 = fVar19;
    }
    fVar19 = fVar10;
    if (fVar20 < fVar10) {
      arr[7] = fVar20;
      arr[10] = fVar10;
      fVar19 = fVar20;
      fVar20 = fVar10;
    }
    fVar10 = local_28;
    if (local_28 < fVar21) {
      arr[0xc] = local_28;
      arr[0x12] = fVar21;
      fVar10 = fVar21;
      fVar21 = local_28;
    }
    if (fVar21 < fVar19) {
      arr[7] = fVar21;
      arr[0xc] = fVar19;
      fVar21 = fVar19;
    }
    if (fVar10 < fVar20) {
      arr[10] = fVar10;
      arr[0x12] = fVar20;
      fVar20 = fVar10;
    }
    fVar19 = local_3c;
    if (local_3c < fVar21) {
      arr[0xc] = local_3c;
      arr[0x14] = fVar21;
      fVar19 = fVar21;
      fVar21 = local_3c;
    }
    if (fVar19 < fVar20) {
      arr[10] = fVar19;
      arr[0x14] = fVar20;
      fVar20 = fVar19;
    }
    if (fVar21 < fVar20) {
      arr[10] = fVar21;
      arr[0xc] = fVar20;
      fVar21 = fVar20;
    }
  }
  return fVar21;
}

Assistant:

elem_type swap_median(elem_type *arr, int n) {

    /*
     * The following routines have been built from knowledge gathered
     * around the Web. I am not aware of any copyright problem with
     * them, so use it as you want.
     * N. Devillard - 1998
     */
    switch (n) {
    case 3:
        /* found on sci.image.processing */
        {
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[1], arr[2]);
            PIX_SORT(arr[0], arr[1]);
            return arr[1];
        }
    case 5:
        /* found on sci.image.processing */
        {
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[3], arr[4]);
            PIX_SORT(arr[0], arr[3]);
            PIX_SORT(arr[1], arr[4]);
            PIX_SORT(arr[1], arr[2]);
            PIX_SORT(arr[2], arr[3]);
            PIX_SORT(arr[1], arr[2]);
            return arr[2];
        }
    case 7:
        /* found on sci.image.processing */
        {
            PIX_SORT(arr[0], arr[5]);
            PIX_SORT(arr[0], arr[3]);
            PIX_SORT(arr[1], arr[6]);
            PIX_SORT(arr[2], arr[4]);
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[3], arr[5]);
            PIX_SORT(arr[2], arr[6]);
            PIX_SORT(arr[2], arr[3]);
            PIX_SORT(arr[3], arr[6]);
            PIX_SORT(arr[4], arr[5]);
            PIX_SORT(arr[1], arr[4]);
            PIX_SORT(arr[1], arr[3]);
            PIX_SORT(arr[3], arr[4]);
            return arr[3];
        }
    case 9:
        /* Formula from: XILINX XCELL magazine, vol. 23 by John L. Smith
           The input array is modified in the process.
           The result array is guaranteed to contain the median value
           in middle position, but other elements are NOT sorted. */
        {
            PIX_SORT(arr[1], arr[2]);
            PIX_SORT(arr[4], arr[5]);
            PIX_SORT(arr[7], arr[8]);
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[3], arr[4]);
            PIX_SORT(arr[6], arr[7]);
            PIX_SORT(arr[1], arr[2]);
            PIX_SORT(arr[4], arr[5]);
            PIX_SORT(arr[7], arr[8]);
            PIX_SORT(arr[0], arr[3]);
            PIX_SORT(arr[5], arr[8]);
            PIX_SORT(arr[4], arr[7]);
            PIX_SORT(arr[3], arr[6]);
            PIX_SORT(arr[1], arr[4]);
            PIX_SORT(arr[2], arr[5]);
            PIX_SORT(arr[4], arr[7]);
            PIX_SORT(arr[4], arr[2]);
            PIX_SORT(arr[6], arr[4]);
            PIX_SORT(arr[4], arr[2]);
            return arr[4];
        }
    case 25:
        /* Code taken from Graphic Gems. */
        {
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[3], arr[4]);
            PIX_SORT(arr[2], arr[4]);
            PIX_SORT(arr[2], arr[3]);
            PIX_SORT(arr[6], arr[7]);
            PIX_SORT(arr[5], arr[7]);
            PIX_SORT(arr[5], arr[6]);
            PIX_SORT(arr[9], arr[10]);
            PIX_SORT(arr[8], arr[10]);
            PIX_SORT(arr[8], arr[9]);
            PIX_SORT(arr[12], arr[13]);
            PIX_SORT(arr[11], arr[13]);
            PIX_SORT(arr[11], arr[12]);
            PIX_SORT(arr[15], arr[16]);
            PIX_SORT(arr[14], arr[16]);
            PIX_SORT(arr[14], arr[15]);
            PIX_SORT(arr[18], arr[19]);
            PIX_SORT(arr[17], arr[19]);
            PIX_SORT(arr[17], arr[18]);
            PIX_SORT(arr[21], arr[22]);
            PIX_SORT(arr[20], arr[22]);
            PIX_SORT(arr[20], arr[21]);
            PIX_SORT(arr[23], arr[24]);
            PIX_SORT(arr[2], arr[5]);
            PIX_SORT(arr[3], arr[6]);
            PIX_SORT(arr[0], arr[6]);
            PIX_SORT(arr[0], arr[3]);
            PIX_SORT(arr[4], arr[7]);
            PIX_SORT(arr[1], arr[7]);
            PIX_SORT(arr[1], arr[4]);
            PIX_SORT(arr[11], arr[14]);
            PIX_SORT(arr[8], arr[14]);
            PIX_SORT(arr[8], arr[11]);
            PIX_SORT(arr[12], arr[15]);
            PIX_SORT(arr[9], arr[15]);
            PIX_SORT(arr[9], arr[12]);
            PIX_SORT(arr[13], arr[16]);
            PIX_SORT(arr[10], arr[16]);
            PIX_SORT(arr[10], arr[13]);
            PIX_SORT(arr[20], arr[23]);
            PIX_SORT(arr[17], arr[23]);
            PIX_SORT(arr[17], arr[20]);
            PIX_SORT(arr[21], arr[24]);
            PIX_SORT(arr[18], arr[24]);
            PIX_SORT(arr[18], arr[21]);
            PIX_SORT(arr[19], arr[22]);
            PIX_SORT(arr[8], arr[17]);
            PIX_SORT(arr[9], arr[18]);
            PIX_SORT(arr[0], arr[18]);
            PIX_SORT(arr[0], arr[9]);
            PIX_SORT(arr[10], arr[19]);
            PIX_SORT(arr[1], arr[19]);
            PIX_SORT(arr[1], arr[10]);
            PIX_SORT(arr[11], arr[20]);
            PIX_SORT(arr[2], arr[20]);
            PIX_SORT(arr[2], arr[11]);
            PIX_SORT(arr[12], arr[21]);
            PIX_SORT(arr[3], arr[21]);
            PIX_SORT(arr[3], arr[12]);
            PIX_SORT(arr[13], arr[22]);
            PIX_SORT(arr[4], arr[22]);
            PIX_SORT(arr[4], arr[13]);
            PIX_SORT(arr[14], arr[23]);
            PIX_SORT(arr[5], arr[23]);
            PIX_SORT(arr[5], arr[14]);
            PIX_SORT(arr[15], arr[24]);
            PIX_SORT(arr[6], arr[24]);
            PIX_SORT(arr[6], arr[15]);
            PIX_SORT(arr[7], arr[16]);
            PIX_SORT(arr[7], arr[19]);
            PIX_SORT(arr[13], arr[21]);
            PIX_SORT(arr[15], arr[23]);
            PIX_SORT(arr[7], arr[13]);
            PIX_SORT(arr[7], arr[15]);
            PIX_SORT(arr[1], arr[9]);
            PIX_SORT(arr[3], arr[11]);
            PIX_SORT(arr[5], arr[17]);
            PIX_SORT(arr[11], arr[17]);
            PIX_SORT(arr[9], arr[17]);
            PIX_SORT(arr[4], arr[10]);
            PIX_SORT(arr[6], arr[12]);
            PIX_SORT(arr[7], arr[14]);
            PIX_SORT(arr[4], arr[6]);
            PIX_SORT(arr[4], arr[7]);
            PIX_SORT(arr[12], arr[14]);
            PIX_SORT(arr[10], arr[14]);
            PIX_SORT(arr[6], arr[7]);
            PIX_SORT(arr[10], arr[12]);
            PIX_SORT(arr[6], arr[10]);
            PIX_SORT(arr[6], arr[17]);
            PIX_SORT(arr[12], arr[17]);
            PIX_SORT(arr[7], arr[17]);
            PIX_SORT(arr[7], arr[10]);
            PIX_SORT(arr[12], arr[18]);
            PIX_SORT(arr[7], arr[12]);
            PIX_SORT(arr[10], arr[18]);
            PIX_SORT(arr[12], arr[20]);
            PIX_SORT(arr[10], arr[20]);
            PIX_SORT(arr[10], arr[12]);
            return arr[12];
        }
    }

    int low = 0, high = n - 1;
    int median, middle, ll, hh;

    median = (low + high) / 2;
    for (;;) {
        if (high <= low)        /* One element only */
            return arr[median];

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]);
            return arr[median];
        }

        /* Find median of low, middle and high items; swap into position low */
        middle = (low + high) / 2;
        if (arr[middle] > arr[high])
            ELEM_SWAP(arr[middle], arr[high]);
        if (arr[low] > arr[high])
            ELEM_SWAP(arr[low], arr[high]);
        if (arr[middle] > arr[low])
            ELEM_SWAP(arr[middle], arr[low]);

        /* Swap low item (now in position middle) into position (low+1) */
        ELEM_SWAP(arr[middle], arr[low + 1]);

        /* Nibble from each end towards middle, swapping items when stuck */
        ll = low + 1;
        hh = high;
        for (;;) {
            do
                ++ll;
            while (arr[low] > arr[ll]);
            do
                --hh;
            while (arr[hh] > arr[low]);

            if (hh < ll)
                break;

            ELEM_SWAP(arr[ll], arr[hh]);
        }

        /* Swap middle item (in position low) back into correct position */
        ELEM_SWAP(arr[low], arr[hh]);

        /* Re-set active partition */
        if (hh <= median)
            low = ll;
        if (hh >= median)
            high = hh - 1;
    }
}